

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O0

void __thiscall
VertexAttrib64Bit::LimitTest::prepareProgram
          (LimitTest *this,_iteration iteration,bool use_arrays,bool use_locations,
          bool use_vertex_attrib_divisor,programInfo *program_info)

{
  GLchar *fragment_shader_code;
  GLuint GVar1;
  GLenum GVar2;
  GLchar *vertex_shader_code_00;
  GLchar *local_78;
  GLchar *temp_varying_name;
  undefined1 local_60 [8];
  string vertex_shader_code;
  string varying_name;
  programInfo *program_info_local;
  bool use_vertex_attrib_divisor_local;
  bool use_locations_local;
  bool use_arrays_local;
  _iteration iteration_local;
  LimitTest *this_local;
  
  std::__cxx11::string::string((string *)(vertex_shader_code.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_60);
  GVar1 = (*(this->super_Base).gl.createProgram)();
  program_info->m_program_id = GVar1;
  GVar2 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar2,"CreateProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0x8f1);
  getProgramDetails(this,iteration,use_arrays,use_locations,use_vertex_attrib_divisor,
                    (string *)((long)&vertex_shader_code.field_2 + 8),(string *)local_60);
  local_78 = (GLchar *)std::__cxx11::string::c_str();
  (*(this->super_Base).gl.transformFeedbackVaryings)(program_info->m_program_id,1,&local_78,0x8c8c);
  GVar2 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar2,"TransformFeedbackVaryings",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0x8fb);
  fragment_shader_code = prepareProgram::fragment_shader_code;
  vertex_shader_code_00 = (GLchar *)std::__cxx11::string::c_str();
  Base::BuildProgram(&this->super_Base,fragment_shader_code,&program_info->m_program_id,
                     vertex_shader_code_00,&program_info->m_fragment_shader_id,
                     &program_info->m_vertex_shader_id);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(vertex_shader_code.field_2._M_local_buf + 8));
  return;
}

Assistant:

void LimitTest::prepareProgram(_iteration iteration, bool use_arrays, bool use_locations,
							   bool use_vertex_attrib_divisor, programInfo& program_info)
{
	static const GLchar* fragment_shader_code = "#version 400\n"
												"#extension GL_ARB_vertex_attrib_64bit : require\n"
												"\n"
												"precision highp float;\n"
												"\n"
												"void main()\n"
												"{\n"
												"    discard;\n"
												"}\n\n";
	std::string varying_name;
	std::string vertex_shader_code;

	program_info.m_program_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "CreateProgram");

	getProgramDetails(iteration, use_arrays, use_locations, use_vertex_attrib_divisor, varying_name,
					  vertex_shader_code);

	{
		const GLchar* temp_varying_name = varying_name.c_str();

		gl.transformFeedbackVaryings(program_info.m_program_id, m_n_varyings, &temp_varying_name,
									 GL_INTERLEAVED_ATTRIBS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TransformFeedbackVaryings");
	}

	BuildProgram(fragment_shader_code, program_info.m_program_id, vertex_shader_code.c_str(),
				 program_info.m_fragment_shader_id, program_info.m_vertex_shader_id);
}